

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bench_impl.h
# Opt level: O2

void run_ellswift_bench(int iters,int argc,char **argv)

{
  void *data_00;
  int iVar1;
  int in_R9D;
  int in_stack_ffffffffffffbf98;
  bench_ellswift_data data;
  
  data_00 = (void *)(ulong)(uint)iters;
  data.ctx = (secp256k1_context *)secp256k1_context_create(1);
  if (argc == 1) {
    run_benchmark("ellswift_encode",bench_ellswift_encode,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
LAB_00102417:
    run_benchmark("ellswift_decode",bench_ellswift_decode,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
    if (argc != 1) goto LAB_00102465;
    run_benchmark("ellswift_keygen",bench_ellswift_create,bench_ellswift_setup,
                  (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
  }
  else {
    iVar1 = have_flag(argc,argv,"ellswift");
    if (iVar1 == 0) {
      iVar1 = have_flag(argc,argv,"encode");
      if (iVar1 != 0) goto LAB_001023b6;
      iVar1 = have_flag(argc,argv,"ellswift_encode");
      if (iVar1 != 0) goto LAB_001023b6;
    }
    else {
LAB_001023b6:
      run_benchmark("ellswift_encode",bench_ellswift_encode,bench_ellswift_setup,
                    (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
    }
    iVar1 = have_flag(argc,argv,"ellswift");
    if (iVar1 != 0) goto LAB_00102417;
    iVar1 = have_flag(argc,argv,"decode");
    if (iVar1 != 0) goto LAB_00102417;
    iVar1 = have_flag(argc,argv,"ellswift_decode");
    if (iVar1 != 0) goto LAB_00102417;
LAB_00102465:
    iVar1 = have_flag(argc,argv,"ellswift");
    if (iVar1 == 0) {
      iVar1 = have_flag(argc,argv,"keygen");
      if (iVar1 != 0) goto LAB_001024a4;
      iVar1 = have_flag(argc,argv,"ellswift_keygen");
      if (iVar1 != 0) goto LAB_001024a4;
    }
    else {
LAB_001024a4:
      run_benchmark("ellswift_keygen",bench_ellswift_create,bench_ellswift_setup,
                    (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
    }
    iVar1 = have_flag(argc,argv,"ellswift");
    if (iVar1 == 0) {
      iVar1 = have_flag(argc,argv,"ecdh");
      if (iVar1 == 0) {
        iVar1 = have_flag(argc,argv,"ellswift_ecdh");
        if (iVar1 == 0) goto LAB_00102527;
      }
    }
  }
  run_benchmark("ellswift_ecdh",bench_ellswift_xdh,bench_ellswift_setup,
                (_func_void_void_ptr_int *)&data,data_00,in_R9D,in_stack_ffffffffffffbf98);
LAB_00102527:
  secp256k1_context_destroy(data.ctx);
  return;
}

Assistant:

void run_ellswift_bench(int iters, int argc, char **argv) {
    bench_ellswift_data data;
    int d = argc == 1;

    /* create a context with signing capabilities */
    data.ctx = secp256k1_context_create(SECP256K1_CONTEXT_NONE);

    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "encode") || have_flag(argc, argv, "ellswift_encode")) run_benchmark("ellswift_encode", bench_ellswift_encode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "decode") || have_flag(argc, argv, "ellswift_decode")) run_benchmark("ellswift_decode", bench_ellswift_decode, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "keygen") || have_flag(argc, argv, "ellswift_keygen")) run_benchmark("ellswift_keygen", bench_ellswift_create, bench_ellswift_setup, NULL, &data, 10, iters);
    if (d || have_flag(argc, argv, "ellswift") || have_flag(argc, argv, "ecdh") || have_flag(argc, argv, "ellswift_ecdh")) run_benchmark("ellswift_ecdh", bench_ellswift_xdh, bench_ellswift_setup, NULL, &data, 10, iters);

    secp256k1_context_destroy(data.ctx);
}